

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O0

void __thiscall pbrt::CameraHandle::PDF_We(CameraHandle *this,Ray *ray,Float *pdfPos,Float *pdfDir)

{
  anon_class_24_3_9d66166c func;
  TaggedPointer<pbrt::PerspectiveCamera,_pbrt::OrthographicCamera,_pbrt::SphericalCamera,_pbrt::RealisticCamera>
  *in_RCX;
  undefined8 in_RSI;
  undefined8 in_RDI;
  Float **unaff_retaddr;
  anon_class_24_3_9d66166c pdf;
  
  func.pdfPos = (Float **)in_RDI;
  func.ray = (Ray *)in_RSI;
  func.pdfDir = unaff_retaddr;
  TaggedPointer<pbrt::PerspectiveCamera,pbrt::OrthographicCamera,pbrt::SphericalCamera,pbrt::RealisticCamera>
  ::Dispatch<pbrt::CameraHandle::PDF_We(pbrt::Ray_const&,float*,float*)const::__0>(in_RCX,func);
  return;
}

Assistant:

void CameraHandle::PDF_We(const Ray &ray, Float *pdfPos, Float *pdfDir) const {
    auto pdf = [&](auto ptr) { return ptr->PDF_We(ray, pdfPos, pdfDir); };
    return Dispatch(pdf);
}